

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall testing::Matcher<mp::CallExpr>::Matcher(Matcher<mp::CallExpr> *this,CallExpr value)

{
  EqMatcher<mp::CallExpr> this_00;
  ExprBase in_RDI;
  EqMatcher<mp::CallExpr> *in_stack_ffffffffffffffd8;
  
  internal::MatcherBase<mp::CallExpr>::MatcherBase((MatcherBase<mp::CallExpr> *)0x15632c);
  *(undefined ***)in_RDI.impl_ = &PTR__Matcher_0029fb30;
  this_00 = Eq<mp::CallExpr>((CallExpr)in_RDI.impl_);
  internal::EqMatcher::operator_cast_to_Matcher(in_stack_ffffffffffffffd8);
  operator=((Matcher<mp::CallExpr> *)
            this_00.rhs_.super_BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41>.super_ExprBase.
            impl_,(Matcher<mp::CallExpr> *)in_RDI.impl_);
  ~Matcher((Matcher<mp::CallExpr> *)0x15638a);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }